

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPlatform.c
# Opt level: O0

char xplt_getch(void)

{
  int iVar1;
  char local_9;
  char c;
  
  local_9 = '\0';
  system("/bin/stty raw");
  while (local_9 == '\0') {
    iVar1 = getchar();
    local_9 = (char)iVar1;
  }
  system("/bin/stty cooked");
  return local_9;
}

Assistant:

char xplt_getch() {
    char c = 0;
    system("/bin/stty raw");
    while (c == 0) {
        c = getchar();
    }
    system("/bin/stty cooked");
    return c;
}